

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::CBString::rtrim(CBString *this,CBString *b)

{
  int iVar1;
  int iVar2;
  
  iVar1 = bninchrr(&this->super_tagbstring,(this->super_tagbstring).slen + -1,&b->super_tagbstring);
  iVar2 = (int)((long)iVar1 + 1);
  (this->super_tagbstring).slen = iVar2;
  if (iVar2 < (this->super_tagbstring).mlen) {
    (this->super_tagbstring).data[(long)iVar1 + 1] = '\0';
  }
  return;
}

Assistant:

void CBString::rtrim (const CBString& b) {
	int l = nreversefindchr (b, slen - 1);
#if BSTR_ERR != -1
	if (l == BSTR_ERR) l = -1;
#endif
	slen = l + 1;
	if (mlen > slen) data[slen] = '\0';
}